

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeEventPoolGetIpcHandle(ze_event_pool_handle_t hEventPool,ze_ipc_event_pool_handle_t *phIpc)

{
  ze_pfnEventPoolGetIpcHandle_t pfnGetIpcHandle;
  ze_result_t result;
  ze_ipc_event_pool_handle_t *phIpc_local;
  ze_event_pool_handle_t hEventPool_local;
  
  pfnGetIpcHandle._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c5a0 != (code *)0x0) {
    pfnGetIpcHandle._4_4_ = (*DAT_0011c5a0)(hEventPool,phIpc);
  }
  return pfnGetIpcHandle._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolGetIpcHandle(
        ze_event_pool_handle_t hEventPool,              ///< [in] handle of event pool object
        ze_ipc_event_pool_handle_t* phIpc               ///< [out] Returned IPC event handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetIpcHandle = context.zeDdiTable.EventPool.pfnGetIpcHandle;
        if( nullptr != pfnGetIpcHandle )
        {
            result = pfnGetIpcHandle( hEventPool, phIpc );
        }
        else
        {
            // generic implementation
        }

        return result;
    }